

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

void __thiscall CMU462::Matrix3x3::operator/=(Matrix3x3 *this,double x)

{
  double *pdVar1;
  undefined4 local_30;
  undefined4 local_2c;
  int j;
  int i;
  double rx;
  Matrix3x3 *A;
  double x_local;
  Matrix3x3 *this_local;
  
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      pdVar1 = operator()(this,local_2c,local_30);
      *pdVar1 = (1.0 / x) * *pdVar1;
    }
  }
  return;
}

Assistant:

void Matrix3x3::operator/=( double x ) {
    Matrix3x3& A( *this );
    double rx = 1./x;

    for( int i = 0; i < 3; i++ )
    for( int j = 0; j < 3; j++ )
    {
       A( i, j ) *= rx;
    }
  }